

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# additional.cpp
# Opt level: O1

BN * CTO(BN *__return_storage_ptr__,vector<BN,_std::allocator<BN>_> *m,
        vector<BN,_std::allocator<BN>_> *v)

{
  BN *pBVar1;
  pointer pBVar2;
  long lVar3;
  invalid_argument *this;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  BN x;
  BN M;
  BN Mi;
  BN local_140;
  BN *local_128;
  vector<BN,_std::allocator<BN>_> *local_120;
  long local_118;
  ulong local_110;
  BN local_108;
  BN local_f0;
  BN local_d8;
  BN local_c0;
  BN local_a8;
  BN local_90;
  BN local_78;
  BN local_60;
  BN local_48;
  
  pBVar1 = (m->super__Vector_base<BN,_std::allocator<BN>_>)._M_impl.super__Vector_impl_data._M_start
  ;
  lVar3 = (long)(m->super__Vector_base<BN,_std::allocator<BN>_>)._M_impl.super__Vector_impl_data.
                _M_finish - (long)pBVar1;
  local_120 = v;
  if (lVar3 == (long)(v->super__Vector_base<BN,_std::allocator<BN>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(v->super__Vector_base<BN,_std::allocator<BN>_>)._M_impl.
                     super__Vector_impl_data._M_start) {
    uVar5 = (int)(lVar3 >> 3) * -0x55555555;
    local_128 = __return_storage_ptr__;
    BN::BN(&local_108,pBVar1);
    if (1 < (int)uVar5) {
      lVar3 = (ulong)(uVar5 & 0x7fffffff) - 1;
      lVar4 = 0x18;
      do {
        BN::operator*(&local_140,&local_108,
                      (BN *)((long)&(((m->super__Vector_base<BN,_std::allocator<BN>_>)._M_impl.
                                      super__Vector_impl_data._M_start)->ba).
                                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                    ._M_impl + lVar4));
        BN::operator=(&local_108,&local_140);
        if (local_140.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
            .super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_140.ba.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
        lVar4 = lVar4 + 0x18;
        lVar3 = lVar3 + -1;
      } while (lVar3 != 0);
    }
    BN::bn0();
    if (0 < (int)uVar5) {
      uVar6 = (ulong)(uVar5 & 0x7fffffff);
      lVar3 = 0;
      do {
        local_110 = uVar6;
        BN::operator/(&local_48,&local_108,
                      (BN *)((long)&(((m->super__Vector_base<BN,_std::allocator<BN>_>)._M_impl.
                                      super__Vector_impl_data._M_start)->ba).
                                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                    ._M_impl + lVar3));
        pBVar2 = (local_120->super__Vector_base<BN,_std::allocator<BN>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        BN::operator/(&local_f0,&local_108,
                      (BN *)((long)&(((m->super__Vector_base<BN,_std::allocator<BN>_>)._M_impl.
                                      super__Vector_impl_data._M_start)->ba).
                                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                    ._M_impl + lVar3));
        BN::operator*(&local_d8,
                      (BN *)((long)&(pBVar2->ba).
                                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                    ._M_impl + lVar3),&local_f0);
        BN::operator/(&local_a8,&local_108,
                      (BN *)((long)&(((m->super__Vector_base<BN,_std::allocator<BN>_>)._M_impl.
                                      super__Vector_impl_data._M_start)->ba).
                                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                    ._M_impl + lVar3));
        local_118 = lVar3;
        BN::BN(&local_c0,
               (BN *)((long)&(((m->super__Vector_base<BN,_std::allocator<BN>_>)._M_impl.
                               super__Vector_impl_data._M_start)->ba).
                             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                             _M_impl + lVar3));
        uVar6 = local_110;
        gcdInverseEuclideanBinary(&local_90,&local_a8,&local_c0);
        BN::operator*(&local_78,&local_d8,&local_90);
        BN::operator%(&local_60,&local_78,&local_108);
        BN::operator+=(&local_140,&local_60);
        if (local_60.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_60.ba.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_78.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_78.ba.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_90.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_90.ba.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_c0.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_c0.ba.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_a8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_a8.ba.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_d8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_d8.ba.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_f0.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_f0.ba.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_48.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_48.ba.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
        lVar3 = local_118 + 0x18;
        uVar6 = uVar6 - 1;
      } while (uVar6 != 0);
    }
    pBVar1 = local_128;
    BN::operator%(local_128,&local_140,&local_108);
    if (local_140.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_140.ba.
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_108.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_108.ba.
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    return pBVar1;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"CTO: Sizes of arrays are different");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

BN CTO(const std::vector <BN>& m, const std::vector <BN>& v)
{
    if(m.size()!=v.size())
        throw invalid_argument("CTO: Sizes of arrays are different");

    int t = m.size();
    BN M = m[0];
    for (int i=1;i<t;i++)
        M = M * m[i];
    BN x(BN::bn0());
    for (int i=0;i<t;i++)
    {
        BN Mi = M/m[i];
        x += v[i] * (M/m[i]) * gcdInverseEuclideanBinary(M/m[i],m[i]) % M;
    }
    return x % M;
}